

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

int CfdFinalizePsbt(void *handle,void *psbt_handle)

{
  pointer pcVar1;
  CfdException *this;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  pcVar1 = local_50 + 0x10;
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_50);
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (*(Psbt **)((long)psbt_handle + 0x18) != (Psbt *)0x0) {
    cfd::core::Psbt::Finalize(*(Psbt **)((long)psbt_handle + 0x18));
    return 0;
  }
  local_50._0_8_ = "cfdcapi_psbt.cpp";
  local_50._8_4_ = 0x20c;
  local_50._16_8_ = "CfdFinalizePsbt";
  cfd::core::logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"psbt is null.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Failed to handle statement. psbt is null.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_50);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdFinalizePsbt(void* handle, void* psbt_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    psbt_obj->psbt->Finalize();
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}